

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

Gia_Man_t * Ses_ManExtractGia(char *pSol)

{
  char cVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *p_01;
  Vec_Ptr_t *vNames_00;
  Vec_Ptr_t *pVVar4;
  bool bVar5;
  bool bVar6;
  int fChild2Comp;
  int fChild1Comp;
  int nChild2;
  int nChild1;
  int nObj;
  Vec_Ptr_t *vNames;
  Vec_Int_t *pGates;
  Gia_Man_t *pGia;
  char *p;
  int i;
  int h;
  char *pSol_local;
  
  p_00 = Gia_ManStart((int)*pSol + (int)pSol[2] + (int)pSol[1] + 1);
  p_00->nConstrs = 0;
  pcVar3 = Extra_UtilStrsav("exact");
  p_00->pName = pcVar3;
  p_01 = Vec_IntAlloc((int)*pSol + (int)pSol[2]);
  vNames_00 = Abc_NodeGetFakeNames((int)*pSol + (int)pSol[1]);
  pVVar4 = Vec_PtrStart((int)*pSol);
  p_00->vNamesIn = pVVar4;
  for (p._0_4_ = 0; (int)p < *pSol; p._0_4_ = (int)p + 1) {
    iVar2 = Gia_ManAppendCi(p_00);
    Vec_IntPush(p_01,iVar2);
    pVVar4 = p_00->vNamesIn;
    pcVar3 = (char *)Vec_PtrEntry(vNames_00,(int)p);
    pcVar3 = Extra_UtilStrsav(pcVar3);
    Vec_PtrSetEntry(pVVar4,(int)p,pcVar3);
  }
  pGia = (Gia_Man_t *)(pSol + 3);
  p._0_4_ = 0;
  while( true ) {
    if (pSol[2] <= (int)p) {
      pVVar4 = Vec_PtrStart((int)pSol[1]);
      p_00->vNamesOut = pVVar4;
      for (p._4_4_ = 0; p._4_4_ < pSol[1]; p._4_4_ = p._4_4_ + 1) {
        cVar1 = *pSol;
        iVar2 = Abc_Lit2Var((int)*(char *)&pGia->pName);
        nChild2 = Vec_IntEntry(p_01,cVar1 + iVar2);
        iVar2 = Abc_LitIsCompl((int)*(char *)&pGia->pName);
        if (iVar2 != 0) {
          nChild2 = Abc_LitNot(nChild2);
        }
        Gia_ManAppendCo(p_00,nChild2);
        pVVar4 = p_00->vNamesOut;
        pcVar3 = (char *)Vec_PtrEntry(vNames_00,*pSol + p._4_4_);
        pcVar3 = Extra_UtilStrsav(pcVar3);
        Vec_PtrSetEntry(pVVar4,p._4_4_,pcVar3);
        pGia = (Gia_Man_t *)((long)&pGia->pName + (long)(*pSol + 2));
      }
      Abc_NodeFreeNames(vNames_00);
      Vec_IntFree(p_01);
      return p_00;
    }
    if (*(char *)((long)&pGia->pName + 1) != '\x02') break;
    fChild1Comp = Vec_IntEntry(p_01,(int)*(char *)((long)&pGia->pName + 2));
    fChild2Comp = Vec_IntEntry(p_01,(int)*(char *)((long)&pGia->pName + 3));
    bVar5 = ((ulong)pGia->pName & 1) != 0;
    if (bVar5) {
      fChild1Comp = Abc_LitNot(fChild1Comp);
    }
    bVar6 = (*(char *)&pGia->pName >> 1 & 1U) != 0;
    if (bVar6) {
      fChild2Comp = Abc_LitNot(fChild2Comp);
    }
    nChild2 = Gia_ManAppendAnd(p_00,fChild1Comp,fChild2Comp);
    if ((bVar5) && (bVar6)) {
      if ((*(char *)&pGia->pName >> 2 & 1U) == 0) {
        __assert_fail("( *p >> 2 ) & 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x751,"Gia_Man_t *Ses_ManExtractGia(const char *)");
      }
      nChild2 = Abc_LitNot(nChild2);
    }
    Vec_IntPush(p_01,nChild2);
    pGia = (Gia_Man_t *)((long)&pGia->pName + 4);
    p._0_4_ = (int)p + 1;
  }
  __assert_fail("p[1] == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                ,0x73f,"Gia_Man_t *Ses_ManExtractGia(const char *)");
}

Assistant:

static Gia_Man_t * Ses_ManExtractGia( char const * pSol )
{
    int h, i;
    char const * p;
    Gia_Man_t * pGia;
    Vec_Int_t * pGates;
    Vec_Ptr_t * vNames;
    int nObj, nChild1, nChild2, fChild1Comp, fChild2Comp;

    pGia = Gia_ManStart( pSol[ABC_EXACT_SOL_NVARS] + pSol[ABC_EXACT_SOL_NGATES] + pSol[ABC_EXACT_SOL_NFUNC] + 1 );
    pGia->nConstrs = 0;
    pGia->pName = Extra_UtilStrsav( "exact" );

    pGates = Vec_IntAlloc( pSol[ABC_EXACT_SOL_NVARS] + pSol[ABC_EXACT_SOL_NGATES] );
    vNames = Abc_NodeGetFakeNames( pSol[ABC_EXACT_SOL_NVARS] + pSol[ABC_EXACT_SOL_NFUNC] );

    /* primary inputs */
    pGia->vNamesIn = Vec_PtrStart( pSol[ABC_EXACT_SOL_NVARS] );
    for ( i = 0; i < pSol[ABC_EXACT_SOL_NVARS]; ++i )
    {
        nObj = Gia_ManAppendCi( pGia );
        Vec_IntPush( pGates, nObj );
        Vec_PtrSetEntry( pGia->vNamesIn, i, Extra_UtilStrsav( (const char*)Vec_PtrEntry( vNames, i ) ) );
    }

    /* gates */
    p = pSol + 3;
    for ( i = 0; i < pSol[ABC_EXACT_SOL_NGATES]; ++i )
    {
        assert( p[1] == 2 );
        nChild1 = Vec_IntEntry( pGates, p[2] );
        nChild2 = Vec_IntEntry( pGates, p[3] );
        fChild1Comp = fChild2Comp = 0;

        if ( *p & 1 )
        {
            nChild1 = Abc_LitNot( nChild1 );
            fChild1Comp = 1;
        }
        if ( ( *p >> 1 ) & 1 )
        {
            nChild2 = Abc_LitNot( nChild2 );
            fChild2Comp = 1;
        }
        nObj = Gia_ManAppendAnd( pGia, nChild1, nChild2 );
        if ( fChild1Comp && fChild2Comp )
        {
            assert( ( *p >> 2 ) & 1 );
            nObj = Abc_LitNot( nObj );
        }

        Vec_IntPush( pGates, nObj );

        p += 4;
    }

    /* outputs */
    pGia->vNamesOut = Vec_PtrStart( pSol[ABC_EXACT_SOL_NFUNC] );
    for ( h = 0; h < pSol[ABC_EXACT_SOL_NFUNC]; ++h )
    {
        nObj = Vec_IntEntry( pGates, pSol[ABC_EXACT_SOL_NVARS] + Abc_Lit2Var( *p ) );
        if ( Abc_LitIsCompl( *p ) )
            nObj = Abc_LitNot( nObj );
        Gia_ManAppendCo( pGia, nObj );
        Vec_PtrSetEntry( pGia->vNamesOut, h, Extra_UtilStrsav( (const char*)Vec_PtrEntry( vNames, pSol[ABC_EXACT_SOL_NVARS] + h ) ) );
        p += ( 2 + pSol[ABC_EXACT_SOL_NVARS] );
    }
    Abc_NodeFreeNames( vNames );

    Vec_IntFree( pGates );

    return pGia;
}